

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileHTTP::Open
          (FileHTTP *this,string *name,Mode openMode,bool async,bool directio)

{
  ushort uVar1;
  in_addr_t iVar2;
  protoent *ppVar3;
  hostent *phVar4;
  char *__cp;
  long *plVar5;
  size_type *psVar6;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::_M_assign((string *)&(this->super_Transport).m_Name);
  ppVar3 = getprotobyname("tcp");
  if (ppVar3 == (protoent *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"transport::file::FileHTTP","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Open","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"cannot make getprotobyname","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_70,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  this->m_p_proto = ppVar3->p_proto;
  phVar4 = gethostbyname((this->m_hostname)._M_dataplus._M_p);
  if (phVar4 == (hostent *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"transport::file::FileHTTP","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Open","");
    std::operator+(&local_d0,"error: gethostbyname ",&this->m_hostname);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_70,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  __cp = inet_ntoa((in_addr)*(in_addr_t *)*phVar4->h_addr_list);
  iVar2 = inet_addr(__cp);
  if (iVar2 == 0xffffffff) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"transport::file::FileHTTP","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Open","");
    std::__cxx11::string::string((string *)local_50,*phVar4->h_addr_list,&local_d1);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x750879);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = plVar5[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_70,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  (this->sockaddr_in).sin_addr.s_addr = iVar2;
  (this->sockaddr_in).sin_family = 2;
  uVar1 = (ushort)this->m_server_port;
  (this->sockaddr_in).sin_port = uVar1 << 8 | uVar1 >> 8;
  return;
}

Assistant:

void FileHTTP::Open(const std::string &name, const Mode openMode, const bool async,
                    const bool directio)
{
    struct protoent *protoent;
    struct hostent *hostent;
    uint32_t addr_tmp;

    m_Name = name;
    /* Build the socket. */
    protoent = getprotobyname("tcp");
    if (protoent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "cannot make getprotobyname");
    }
    m_p_proto = protoent->p_proto;

    /* get from parameters. Where the proxy should run*/

    /* Build the address. */
#define _WINSOCK_DEPRECATED_NO_WARNINGS 1
    hostent = gethostbyname(m_hostname.c_str());
    if (hostent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "error: gethostbyname " + m_hostname);
    }
    addr_tmp = inet_addr(inet_ntoa(*(struct in_addr *)*(hostent->h_addr_list)));
    if (addr_tmp == INADDR_NONE)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "error: inet_addr " +
                                                  std::string(*(hostent->h_addr_list)));
    }
    sockaddr_in.sin_addr.s_addr = addr_tmp;
    sockaddr_in.sin_family = AF_INET;
    sockaddr_in.sin_port = htons(m_server_port);

    return;
}